

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O0

OptionStatus
setLocalOptionValue(HighsLogOptions *report_log_options,string *name,HighsLogOptions *log_options,
                   vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *option_records,
                   char *value)

{
  OptionStatus OVar1;
  char *in_R8;
  string value_as_string;
  string *in_stack_00000108;
  vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *in_stack_00000110;
  HighsLogOptions *in_stack_00000118;
  string *in_stack_00000120;
  HighsLogOptions *in_stack_00000128;
  string local_80 [55];
  allocator local_49;
  string local_48 [72];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,in_R8,&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::__cxx11::string::string(local_80,local_48);
  OVar1 = setLocalOptionValue(in_stack_00000128,in_stack_00000120,in_stack_00000118,
                              in_stack_00000110,in_stack_00000108);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_48);
  return OVar1;
}

Assistant:

OptionStatus setLocalOptionValue(const HighsLogOptions& report_log_options,
                                 const std::string& name,
                                 HighsLogOptions& log_options,
                                 std::vector<OptionRecord*>& option_records,
                                 const char* value) {
  // Handles values passed as explicit values in quotes
  std::string value_as_string(value);
  return setLocalOptionValue(report_log_options, name, log_options,
                             option_records, value_as_string);
}